

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_true,_false>::shrink(DaTrie<true,_true,_false> *this)

{
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::shrink_to_fit
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x169a88);
  std::vector<char,_std::allocator<char>_>::shrink_to_fit
            ((vector<char,_std::allocator<char>_> *)0x169a96);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::shrink_to_fit
            ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x169aa4);
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::shrink_to_fit
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x169ab2);
  return;
}

Assistant:

void shrink() {
    bc_.shrink_to_fit();
    tail_.shrink_to_fit();
    blocks_.shrink_to_fit();
    if (WithNLM) {
      node_links_.shrink_to_fit();
    }
  }